

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks_connecter.cpp
# Opt level: O0

void __thiscall zmq::socks_connecter_t::error(socks_connecter_t *this)

{
  int __fd;
  stream_connecter_base_t *in_RDI;
  stream_connecter_base_t *in_stack_00000060;
  handle_t in_stack_ffffffffffffffe8;
  
  __fd = (int)in_RDI->_handle;
  io_object_t::rm_fd((io_object_t *)in_RDI,in_stack_ffffffffffffffe8);
  stream_connecter_base_t::close(in_RDI,__fd);
  socks_greeting_encoder_t::reset((socks_greeting_encoder_t *)(in_RDI + 1));
  socks_choice_decoder_t::reset
            ((socks_choice_decoder_t *)(in_RDI[1].super_own_t.options.routing_id + 0xef));
  socks_basic_auth_request_encoder_t::reset
            ((socks_basic_auth_request_encoder_t *)(in_RDI[1].super_own_t.options.routing_id + 0xff)
            );
  socks_auth_response_decoder_t::reset
            ((socks_auth_response_decoder_t *)
             (in_RDI[1].super_own_t.options.curve_secret_key + 0x10));
  socks_request_encoder_t::reset
            ((socks_request_encoder_t *)in_RDI[1].super_own_t.options.curve_server_key);
  socks_response_decoder_t::reset
            ((socks_response_decoder_t *)&in_RDI[1].super_own_t.options.wss_cert_pem);
  *(undefined4 *)&in_RDI[2].super_own_t.super_object_t._vptr_object_t = 0;
  stream_connecter_base_t::add_reconnect_timer(in_stack_00000060);
  return;
}

Assistant:

void zmq::socks_connecter_t::error ()
{
    rm_fd (_handle);
    close ();
    _greeting_encoder.reset ();
    _choice_decoder.reset ();
    _basic_auth_request_encoder.reset ();
    _auth_response_decoder.reset ();
    _request_encoder.reset ();
    _response_decoder.reset ();
    _status = unplugged;
    add_reconnect_timer ();
}